

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hyb_gga_xc_cam_b3lyp.c
# Opt level: O0

void cam_set_ext_params(xc_func_type *p,double *ext_params)

{
  xc_func_type *in_RSI;
  xc_func_type *in_RDI;
  double *ext_params_00;
  double dVar1;
  double dVar2;
  double omega;
  double beta;
  double alpha;
  
  ext_params_00 = (double *)get_ext_param(in_RDI,(double *)in_RSI,0);
  dVar1 = get_ext_param(in_RDI,(double *)in_RSI,1);
  dVar2 = get_ext_param(in_RDI,(double *)in_RSI,2);
  *in_RDI->mix_coef = 1.0 - (double)ext_params_00;
  in_RDI->mix_coef[1] = -dVar1;
  in_RDI->cam_omega = dVar2;
  in_RDI->cam_alpha = (double)ext_params_00;
  in_RDI->cam_beta = dVar1;
  xc_func_set_ext_params(in_RSI,ext_params_00);
  return;
}

Assistant:

static void
cam_set_ext_params(xc_func_type *p, const double *ext_params)
{
  double alpha, beta, omega;

  assert(p != NULL);
  alpha  = get_ext_param(p, ext_params, 0);
  beta   = get_ext_param(p, ext_params, 1);
  omega  = get_ext_param(p, ext_params, 2);

  p->mix_coef[0] = 1.0 - alpha;
  p->mix_coef[1] = -beta;

  xc_func_set_ext_params_name(p->func_aux[1], "_omega", omega);
  set_ext_params_cam(p, ext_params);
}